

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void jpgd::jpeg_decoder::decode_block_dc_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  uint uVar2;
  uint8 *puVar3;
  coeff_buf *pcVar4;
  uint8 uVar5;
  uint8 uVar6;
  uint uVar7;
  
  iVar1 = pD->m_bits_left;
  uVar2 = pD->m_bit_buf;
  pD->m_bits_left = iVar1 + -1;
  if (1 < iVar1) {
    pD->m_bit_buf = uVar2 * 2;
    goto LAB_00151841;
  }
  uVar7 = uVar2 << ((byte)iVar1 & 0x1f);
  pD->m_bit_buf = uVar7;
  if (pD->m_in_buf_left < 2) {
LAB_001517fe:
    uVar5 = get_octet(pD);
    uVar6 = get_octet(pD);
    pD->m_bit_buf = pD->m_bit_buf | (uint)CONCAT11(uVar5,uVar6);
  }
  else {
    puVar3 = pD->m_pIn_buf_ofs;
    if ((*puVar3 == 0xff) || (puVar3[1] == 0xff)) goto LAB_001517fe;
    pD->m_bit_buf = CONCAT11(*puVar3,puVar3[1]) | uVar7;
    pD->m_in_buf_left = pD->m_in_buf_left + -2;
    pD->m_pIn_buf_ofs = puVar3 + 2;
  }
  iVar1 = pD->m_bits_left;
  pD->m_bit_buf = pD->m_bit_buf << (-(char)iVar1 & 0x1fU);
  pD->m_bits_left = iVar1 + 0x10;
  if (iVar1 < -0x10) {
    __assert_fail("m_bits_left >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                  ,0x203,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
  }
LAB_00151841:
  if ((int)uVar2 < 0) {
    pcVar4 = pD->m_dc_coeffs[component_id];
    if ((pcVar4->block_num_x <= block_x) || (pcVar4->block_num_y <= block_y)) {
      stop_decoding(pD,JPGD_DECODE_ERROR);
    }
    *(ushort *)
     (pcVar4->pData +
     (long)(pcVar4->block_num_x * block_y * pcVar4->block_size) +
     (long)(block_x * pcVar4->block_size)) =
         *(ushort *)
          (pcVar4->pData +
          (long)(pcVar4->block_num_x * block_y * pcVar4->block_size) +
          (long)(block_x * pcVar4->block_size)) | (ushort)(1 << ((byte)pD->m_successive_low & 0x1f))
    ;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_refine(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		if (pD->get_bits_no_markers(1))
		{
			jpgd_block_coeff_t* p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

			p[0] |= (1 << pD->m_successive_low);
		}
	}